

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::QuantileBindData::Deserialize(Deserializer *deserializer,AggregateFunction *function)

{
  _Head_base<0UL,_duckdb::QuantileBindData_*,_false> _Var1;
  pointer pVVar2;
  QuantileSerializationType QVar3;
  int iVar4;
  uint uVar5;
  QuantileBindData *this;
  pointer pQVar6;
  _func_int **pp_Var7;
  pointer v;
  vector<duckdb::Value,_true> raw;
  string str;
  _Head_base<0UL,_duckdb::QuantileBindData_*,_false> local_c0;
  vector<duckdb::Value,_true> local_b8;
  QuantileValue local_98;
  
  this = (QuantileBindData *)operator_new(0x40);
  QuantileBindData(this);
  local_b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (Value *)0x0;
  local_b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Value *)0x0;
  local_b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c0._M_head_impl = this;
  Deserializer::ReadProperty<duckdb::vector<duckdb::Value,true>>
            ((Deserializer *)function,100,"quantiles",&local_b8);
  pQVar6 = unique_ptr<duckdb::QuantileBindData,_std::default_delete<duckdb::QuantileBindData>,_true>
           ::operator->((unique_ptr<duckdb::QuantileBindData,_std::default_delete<duckdb::QuantileBindData>,_true>
                         *)&local_c0);
  Deserializer::ReadProperty<duckdb::vector<unsigned_long,true>>
            ((Deserializer *)function,0x65,"order",&pQVar6->order);
  pQVar6 = unique_ptr<duckdb::QuantileBindData,_std::default_delete<duckdb::QuantileBindData>,_true>
           ::operator->((unique_ptr<duckdb::QuantileBindData,_std::default_delete<duckdb::QuantileBindData>,_true>
                         *)&local_c0);
  (*(function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[2])
            (function,0x66,"desc");
  iVar4 = (*(function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function
            [0xc])(function);
  pQVar6->desc = SUB41(iVar4,0);
  (*(function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[3])
            (function);
  iVar4 = (*(function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function
            [4])(function,0x67,"quantile_type");
  if ((char)iVar4 == '\0') {
    (*(function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[5])
              (function,0);
  }
  else {
    if (*(char *)&(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
                  _M_dataplus._M_p == '\x01') {
      (*(function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function
        [0x1a])(&local_98,function);
      QVar3 = EnumUtil::FromString<duckdb::QuantileSerializationType>
                        ((char *)local_98.val.type_._0_8_);
      if ((char **)local_98.val.type_._0_8_ != (char **)((long)&local_98 + 0x10U)) {
        operator_delete((void *)local_98.val.type_._0_8_);
      }
    }
    else {
      iVar4 = (*(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.
                _vptr_Function[0xf])(function);
      QVar3 = (QuantileSerializationType)iVar4;
    }
    (*(function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[5])
              (function,1);
    if (QVar3 != NON_DECIMAL) {
      uVar5 = (*(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.
                _vptr_Function[4])(function,0x68,"logical_type");
      pp_Var7 = (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.
                _vptr_Function;
      if ((char)uVar5 != '\0') {
        (*pp_Var7[6])(function);
        LogicalType::Deserialize((LogicalType *)&local_98,(Deserializer *)function);
        (*(function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[7]
        )(function);
        LogicalType::~LogicalType((LogicalType *)&local_98);
        pp_Var7 = (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.
                  _vptr_Function;
      }
      (*pp_Var7[5])(function,(ulong)(uVar5 & 0xff));
    }
  }
  pVVar2 = local_b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    v = local_b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start;
    do {
      pQVar6 = unique_ptr<duckdb::QuantileBindData,_std::default_delete<duckdb::QuantileBindData>,_true>
               ::operator->((unique_ptr<duckdb::QuantileBindData,_std::default_delete<duckdb::QuantileBindData>,_true>
                             *)&local_c0);
      QuantileValue::QuantileValue(&local_98,v);
      ::std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>::
      emplace_back<duckdb::QuantileValue>
                (&(pQVar6->quantiles).
                  super_vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>,
                 &local_98);
      Value::~Value(&local_98.val);
      v = v + 1;
    } while (v != pVVar2);
  }
  _Var1._M_head_impl = local_c0._M_head_impl;
  local_c0._M_head_impl = (QuantileBindData *)0x0;
  deserializer->_vptr_Deserializer = (_func_int **)_Var1._M_head_impl;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b8);
  if (local_c0._M_head_impl != (QuantileBindData *)0x0) {
    (*((local_c0._M_head_impl)->super_FunctionData)._vptr_FunctionData[1])();
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)deserializer;
}

Assistant:

unique_ptr<FunctionData> QuantileBindData::Deserialize(Deserializer &deserializer, AggregateFunction &function) {
	auto result = make_uniq<QuantileBindData>();
	vector<Value> raw;
	deserializer.ReadProperty(100, "quantiles", raw);
	deserializer.ReadProperty(101, "order", result->order);
	deserializer.ReadProperty(102, "desc", result->desc);
	QuantileSerializationType deserialization_type;
	deserializer.ReadPropertyWithExplicitDefault(103, "quantile_type", deserialization_type,
	                                             QuantileSerializationType::NON_DECIMAL);

	if (deserialization_type != QuantileSerializationType::NON_DECIMAL) {
		deserializer.ReadDeletedProperty<LogicalType>(104, "logical_type");
	}

	for (const auto &r : raw) {
		result->quantiles.emplace_back(QuantileValue(r));
	}
	return std::move(result);
}